

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_scatterplot.cpp
# Opt level: O2

void Omega_h::write_linear_scatterplot<2>
               (string *path,Mesh *mesh,Int ent_dim,Reals *data,Vector<2> direction,Vector<2> origin
               ,string *separator)

{
  Write<double> local_90;
  Write<double> local_80;
  Write<double> local_70;
  Reals coords_1d;
  Reals coords;
  
  Mesh::coords((Mesh *)&stack0xffffffffffffffc0);
  average_field((Omega_h *)&coords,mesh,ent_dim,2,(Reals *)&stack0xffffffffffffffc0);
  Write<double>::~Write((Write<double> *)&stack0xffffffffffffffc0);
  Write<double>::Write(&local_70,&coords.write_);
  get_linear_scatter_coords<2>(&coords_1d,direction,origin);
  Write<double>::~Write(&local_70);
  Write<double>::Write(&local_80,&coords_1d.write_);
  Write<double>::Write(&local_90,&data->write_);
  write_scatterplot(path,mesh,ent_dim,(Reals *)&local_80,(Reals *)&local_90,separator);
  Write<double>::~Write(&local_90);
  Write<double>::~Write(&local_80);
  Write<double>::~Write(&coords_1d.write_);
  Write<double>::~Write(&coords.write_);
  return;
}

Assistant:

void write_linear_scatterplot(std::string const& path, Mesh* mesh, Int ent_dim,
    Reals data, Vector<dim> direction, Vector<dim> origin,
    std::string const& separator) {
  auto coords =
      average_field(mesh, ent_dim, dim, mesh->coords());  // get centroids
  auto coords_1d = get_linear_scatter_coords(coords, direction, origin);
  write_scatterplot(path, mesh, ent_dim, coords_1d, data, separator);
}